

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O0

void UI::process_co_ords(vector<int,_std::allocator<int>_> *co_ords,int *points_gathered)

{
  int iVar1;
  bool bVar2;
  allocator<char> local_109;
  string local_108;
  int local_e8;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string placeholder;
  int *points_gathered_local;
  vector<int,_std::allocator<int>_> *co_ords_local;
  
  placeholder.field_2._8_8_ = points_gathered;
  std::__cxx11::string::string((string *)local_38);
  iVar1 = *(int *)placeholder.field_2._8_8_;
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Please enter X1 co_ordinate:",&local_59);
    print_ln(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  else if (iVar1 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Please enter Y1 co_ordinate:",&local_91);
    print_ln(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  else if (iVar1 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Please enter X2 co_ordinate:",&local_b9);
    print_ln(&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Please enter Y2 co_ordinate:",&local_e1);
    print_ln(&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)local_38);
  bVar2 = isinteger((string *)local_38);
  if (bVar2) {
    local_e8 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
    std::vector<int,_std::allocator<int>_>::push_back(co_ords,&local_e8);
    if (*(int *)placeholder.field_2._8_8_ < 3) {
      *(int *)placeholder.field_2._8_8_ = *(int *)placeholder.field_2._8_8_ + 1;
      process_co_ords(co_ords,(int *)placeholder.field_2._8_8_);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"The last value entered is not an integer.",&local_109);
    print_ln(&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    process_co_ords(co_ords,(int *)placeholder.field_2._8_8_);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void UI::process_co_ords(std::vector<int> &co_ords, int &points_gathered)
{
    std::string placeholder;
    switch (points_gathered)
    {
    case 0:
        print_ln("Please enter X1 co_ordinate:");
        break;
    case 1:
        print_ln("Please enter Y1 co_ordinate:");
        break;
    case 2:
        print_ln("Please enter X2 co_ordinate:");
        break;
    default:
        print_ln("Please enter Y2 co_ordinate:");
        break;
    }
    getline(std::cin, placeholder);
    if (isinteger(placeholder))
    {
        co_ords.push_back(std::stoi(placeholder));
        if (points_gathered < 3)
        {
            points_gathered++;
            process_co_ords(co_ords, points_gathered);
        }
    }
    else
    {
        print_ln("The last value entered is not an integer.");
        process_co_ords(co_ords, points_gathered);
    }
}